

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

int gap_lr_spill_cost(gen_ctx_t gen_ctx,live_range_t_conflict lr)

{
  bb_t_conflict bb_00;
  int iVar1;
  int local_60;
  int local_5c;
  out_edge_t local_58;
  edge_t_conflict e;
  int local_48;
  int bb_level;
  int max_level;
  int level;
  bb_t_conflict bb;
  lr_bb_t_conflict lr_bb_1;
  lr_bb_t_conflict plStack_28;
  int cost;
  lr_bb_t_conflict lr_bb;
  int cost_factor;
  live_range_t_conflict lr_local;
  gen_ctx_t gen_ctx_local;
  
  bitmap_clear(gen_ctx->temp_bitmap);
  for (plStack_28 = lr->lr_bb; plStack_28 != (lr_bb_t_conflict)0x0; plStack_28 = plStack_28->next) {
    bitmap_set_bit_p(gen_ctx->temp_bitmap,plStack_28->bb->index);
  }
  lr_bb_1._4_4_ = 0;
  for (bb = (bb_t_conflict)lr->lr_bb; bb != (bb_t_conflict)0x0; bb = (bb_t_conflict)bb->pre) {
    bb_00 = (bb_t_conflict)bb->index;
    local_60 = bb_loop_level(bb_00);
    local_60 = local_60 + 1;
    local_48 = -1;
    for (local_58 = DLIST_out_edge_t_head(&bb_00->out_edges); local_58 != (out_edge_t)0x0;
        local_58 = DLIST_out_edge_t_next(local_58)) {
      iVar1 = bitmap_bit_p(gen_ctx->temp_bitmap,local_58->dst->index);
      if (iVar1 == 0) {
        iVar1 = bb_loop_level(local_58->dst);
        if (local_48 < iVar1 + 1) {
          local_48 = iVar1 + 1;
        }
      }
    }
    if (-1 < local_48) {
      local_5c = local_60;
      if (local_48 < local_60) {
        local_5c = local_48;
      }
      lr_bb_1._4_4_ = local_5c * 2 + lr_bb_1._4_4_;
    }
    local_48 = -1;
    for (local_58 = DLIST_in_edge_t_head(&bb_00->in_edges); local_58 != (in_edge_t_conflict)0x0;
        local_58 = DLIST_in_edge_t_next(local_58)) {
      iVar1 = bitmap_bit_p(gen_ctx->temp_bitmap,local_58->src->index);
      if (iVar1 == 0) {
        iVar1 = bb_loop_level(local_58->src);
        if (local_48 < iVar1 + 1) {
          local_48 = iVar1 + 1;
        }
      }
    }
    if (-1 < local_48) {
      if (local_48 < local_60) {
        local_60 = local_48;
      }
      lr_bb_1._4_4_ = local_60 * 2 + lr_bb_1._4_4_;
    }
  }
  return lr_bb_1._4_4_;
}

Assistant:

static int gap_lr_spill_cost (gen_ctx_t gen_ctx, live_range_t lr) {
  int cost_factor = LOOP_COST_FACTOR / 2;
  bitmap_clear (temp_bitmap);
  for (lr_bb_t lr_bb = lr->lr_bb; lr_bb != NULL; lr_bb = lr_bb->next)
    bitmap_set_bit_p (temp_bitmap, lr_bb->bb->index);
  int cost = 0;
  for (lr_bb_t lr_bb = lr->lr_bb; lr_bb != NULL; lr_bb = lr_bb->next) {
    bb_t bb = lr_bb->bb;
    int level, max_level, bb_level = bb_loop_level (bb) + 1;
    edge_t e;
    max_level = -1;
    for (e = DLIST_HEAD (out_edge_t, bb->out_edges); e != NULL; e = DLIST_NEXT (out_edge_t, e))
      if (!bitmap_bit_p (temp_bitmap, e->dst->index)
          && (level = bb_loop_level (e->dst) + 1) > max_level)
        max_level = level;
    if (max_level >= 0) cost += (max_level < bb_level ? max_level : bb_level) * cost_factor;
    max_level = -1;
    for (e = DLIST_HEAD (in_edge_t, bb->in_edges); e != NULL; e = DLIST_NEXT (in_edge_t, e))
      if (!bitmap_bit_p (temp_bitmap, e->src->index)
          && (level = bb_loop_level (e->src) + 1) > max_level)
        max_level = level;
    if (max_level >= 0) cost += (max_level < bb_level ? max_level : bb_level) * cost_factor;
  }
  return cost;
}